

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool Args::details::isFlag(String *word)

{
  int iVar1;
  QByteArrayView QVar2;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  QArrayData *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  QVar2.m_data = (storage_type *)0x2;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  local_48 = local_28;
  uStack_40 = uStack_20;
  local_38 = local_18;
  iVar1 = QString::indexOf(&word->m_str,(longlong)&local_48,CaseInsensitive);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  if ((iVar1 != 0) &&
     (iVar1 = QString::indexOf((QChar)(char16_t)word,0x2d,CaseInsensitive), iVar1 == 0)) {
    return true;
  }
  return false;
}

Assistant:

static inline bool
isFlag( const String & word )
{
	if( !isArgument( word ) )
	{
		if( word.find( SL( '-' ) ) == 0 )
			return true;
	}

	return false;
}